

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O1

void __thiscall embree::XMLWriter::store(XMLWriter *this,char *name,char *str)

{
  int iVar1;
  size_t sVar2;
  undefined1 *puVar3;
  ulong uVar4;
  
  if (this->ident != 0) {
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10," ",1);
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->ident);
  }
  puVar3 = &this->field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar3,"<",1);
  iVar1 = (int)puVar3;
  if (name == (char *)0x0) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)puVar3 + -0x18));
  }
  else {
    sVar2 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar3,name,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar3,">\"",2);
  if (str == (char *)0x0) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)puVar3 + -0x18));
  }
  else {
    sVar2 = strlen(str);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar3,str,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar3,"\"</",3);
  if (name == (char *)0x0) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)puVar3 + -0x18));
  }
  else {
    sVar2 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar3,name,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar3,">",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)puVar3 + -0x18) + (char)puVar3);
  std::ostream::put((char)puVar3);
  std::ostream::flush();
  return;
}

Assistant:

void XMLWriter::store(const char* name, const char* str) {
    tab(); xml << "<" << name << ">\"" << str << "\"</" << name << ">" << std::endl;
  }